

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCore.c
# Opt level: O2

int Dar_ManCutCount(Aig_Man_t *pAig,int *pnCutsK)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  int i;
  
  iVar3 = 0;
  for (i = 0; i < pAig->vObjs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(pAig->vObjs,i);
    if ((pvVar1 != (void *)0x0) &&
       (0xfffffffd < ((uint)*(undefined8 *)((long)pvVar1 + 0x18) & 7) - 7)) {
      for (lVar2 = 0;
          (uint)(byte)((ulong)*(undefined8 *)((long)pvVar1 + 0x18) >> 0x38) * 0x18 != (int)lVar2;
          lVar2 = lVar2 + 0x18) {
        if ((*(uint *)(*(long *)((long)pvVar1 + 0x28) + 4 + lVar2) >> 0x1c & 1) != 0) {
          iVar3 = iVar3 + 1;
        }
      }
    }
  }
  if (pnCutsK != (int *)0x0) {
    *pnCutsK = 0;
  }
  return iVar3;
}

Assistant:

int Dar_ManCutCount( Aig_Man_t * pAig, int * pnCutsK )
{
    Dar_Cut_t * pCut;
    Aig_Obj_t * pObj;
    int i, k, nCuts = 0, nCutsK = 0;
    Aig_ManForEachNode( pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
        {
            nCuts++;
            if ( pCut->nLeaves == 4 )
                nCutsK++;
        }
    if ( pnCutsK )
        *pnCutsK = nCutsK;
    return nCuts;
}